

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O3

void __thiscall ImGuizmo::matrix_t::OrthoNormalize(matrix_t *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar12 = (this->field_0).m[0][0];
  fVar1 = (this->field_0).m[0][1];
  fVar2 = (this->field_0).m[0][2];
  fVar3 = (this->field_0).m[0][3];
  fVar4 = (this->field_0).m[1][0];
  fVar5 = (this->field_0).m[1][1];
  fVar6 = (this->field_0).m[1][2];
  fVar7 = (this->field_0).m[1][3];
  fVar8 = (this->field_0).m[2][0];
  fVar9 = (this->field_0).m[2][1];
  fVar10 = (this->field_0).m[2][2];
  fVar11 = (this->field_0).m[2][3];
  fVar13 = 1.0 / SQRT(fVar2 * fVar2 + fVar12 * fVar12 + fVar1 * fVar1);
  (this->field_0).m[0][0] = fVar13 * fVar12;
  (this->field_0).m[0][1] = fVar13 * fVar1;
  (this->field_0).m[0][2] = fVar13 * fVar2;
  (this->field_0).m[0][3] = fVar13 * fVar3;
  fVar12 = 1.0 / SQRT(fVar6 * fVar6 + fVar4 * fVar4 + fVar5 * fVar5);
  (this->field_0).m[1][0] = fVar12 * fVar4;
  (this->field_0).m[1][1] = fVar12 * fVar5;
  (this->field_0).m[1][2] = fVar12 * fVar6;
  (this->field_0).m[1][3] = fVar12 * fVar7;
  fVar12 = 1.0 / SQRT(fVar10 * fVar10 + fVar8 * fVar8 + fVar9 * fVar9);
  (this->field_0).m[2][0] = fVar12 * fVar8;
  (this->field_0).m[2][1] = fVar12 * fVar9;
  (this->field_0).m[2][2] = fVar12 * fVar10;
  (this->field_0).m[2][3] = fVar12 * fVar11;
  return;
}

Assistant:

vec_t Normalize() { (*this) *= (1.f / Length()); return (*this); }